

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_horizontal_filter_coeff_beta0_avx2(int alpha,int sx,__m256i *coeff)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*in_RDX) [32];
  int in_ESI;
  int in_EDI;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  __m256i tmp_15;
  __m256i tmp_14;
  __m256i tmp_13;
  __m256i tmp_12;
  __m128i tmp_7;
  __m128i tmp_6;
  __m128i tmp_5;
  __m128i tmp_4;
  __m128i tmp_3;
  __m128i tmp_2;
  __m128i tmp_1;
  __m128i tmp_0;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  auVar16._8_8_ = 0;
  auVar16._0_8_ = av1_filter_8bit[in_ESI >> 10];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 2 >> 10];
  auVar1 = vpunpcklwd_avx(auVar16,auVar1);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = av1_filter_8bit[in_ESI + in_EDI >> 10];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 3 >> 10];
  auVar2 = vpunpcklwd_avx(auVar15,auVar2);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 4 >> 10];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 6 >> 10];
  auVar3 = vpunpcklwd_avx(auVar14,auVar3);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 5 >> 10];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = av1_filter_8bit[in_ESI + in_EDI * 7 >> 10];
  vpunpcklwd_avx(auVar13,auVar12);
  local_420 = auVar1._0_8_;
  uStack_418 = auVar1._8_8_;
  local_430 = auVar2._0_8_;
  uStack_428 = auVar2._8_8_;
  local_460 = auVar3._0_8_;
  uStack_458 = auVar3._8_8_;
  auVar6._8_8_ = uStack_28;
  auVar6._0_8_ = uStack_30;
  auVar6._16_8_ = uStack_30;
  auVar6._24_8_ = uStack_28;
  auVar4._16_8_ = local_430;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_428;
  auVar6 = vpunpckldq_avx2(auVar6,auVar4);
  auVar11._8_8_ = uStack_28;
  auVar11._0_8_ = uStack_30;
  auVar11._16_8_ = uStack_30;
  auVar11._24_8_ = uStack_28;
  auVar10._16_8_ = local_430;
  auVar10._0_16_ = auVar2;
  auVar10._24_8_ = uStack_428;
  auVar4 = vpunpckhdq_avx2(auVar11,auVar10);
  auVar7._16_8_ = local_420;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_418;
  auVar5._16_8_ = local_460;
  auVar5._0_16_ = auVar3;
  auVar5._24_8_ = uStack_458;
  auVar7 = vpunpckldq_avx2(auVar7,auVar5);
  auVar9._16_8_ = local_420;
  auVar9._0_16_ = auVar1;
  auVar9._24_8_ = uStack_418;
  auVar8._16_8_ = local_460;
  auVar8._0_16_ = auVar3;
  auVar8._24_8_ = uStack_458;
  auVar5 = vpunpckhdq_avx2(auVar9,auVar8);
  auVar8 = vpunpcklqdq_avx2(auVar6,auVar7);
  *in_RDX = auVar8;
  auVar6 = vpunpckhqdq_avx2(auVar6,auVar7);
  in_RDX[1] = auVar6;
  auVar6 = vpunpcklqdq_avx2(auVar4,auVar5);
  in_RDX[2] = auVar6;
  auVar4 = vpunpckhqdq_avx2(auVar4,auVar5);
  in_RDX[3] = auVar4;
  return;
}

Assistant:

static inline void prepare_horizontal_filter_coeff_beta0_avx2(int alpha, int sx,
                                                              __m256i *coeff) {
  __m128i tmp_0 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 0 * alpha) >> WARPEDDIFF_PREC_BITS]);
  __m128i tmp_1 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 1 * alpha) >> WARPEDDIFF_PREC_BITS]);
  __m128i tmp_2 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 2 * alpha) >> WARPEDDIFF_PREC_BITS]);
  __m128i tmp_3 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 3 * alpha) >> WARPEDDIFF_PREC_BITS]);
  __m128i tmp_4 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 4 * alpha) >> WARPEDDIFF_PREC_BITS]);
  __m128i tmp_5 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 5 * alpha) >> WARPEDDIFF_PREC_BITS]);
  __m128i tmp_6 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 6 * alpha) >> WARPEDDIFF_PREC_BITS]);
  __m128i tmp_7 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 7 * alpha) >> WARPEDDIFF_PREC_BITS]);

  tmp_0 = _mm_unpacklo_epi16(tmp_0, tmp_2);
  tmp_1 = _mm_unpacklo_epi16(tmp_1, tmp_3);
  tmp_4 = _mm_unpacklo_epi16(tmp_4, tmp_6);
  tmp_5 = _mm_unpacklo_epi16(tmp_5, tmp_7);

  const __m256i tmp_12 = _mm256_broadcastsi128_si256(tmp_0);
  const __m256i tmp_13 = _mm256_broadcastsi128_si256(tmp_1);
  const __m256i tmp_14 = _mm256_broadcastsi128_si256(tmp_4);
  const __m256i tmp_15 = _mm256_broadcastsi128_si256(tmp_5);

  const __m256i res_0 = _mm256_unpacklo_epi32(tmp_12, tmp_14);
  const __m256i res_1 = _mm256_unpackhi_epi32(tmp_12, tmp_14);
  const __m256i res_2 = _mm256_unpacklo_epi32(tmp_13, tmp_15);
  const __m256i res_3 = _mm256_unpackhi_epi32(tmp_13, tmp_15);

  coeff[0] = _mm256_unpacklo_epi64(res_0, res_2);
  coeff[1] = _mm256_unpackhi_epi64(res_0, res_2);
  coeff[2] = _mm256_unpacklo_epi64(res_1, res_3);
  coeff[3] = _mm256_unpackhi_epi64(res_1, res_3);
}